

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O2

size_t read_ints_single(uint8_t *in,uint32_t *out,int length)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar3 = 0;
  uVar2 = (ulong)(uint)(~(length >> 0x1f) & length);
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    uVar1 = read_int(in + sVar3,out);
    sVar3 = sVar3 + uVar1;
    out = out + 1;
  }
  return sVar3;
}

Assistant:

size_t read_ints_single(const uint8_t *in, uint32_t *out, int length) {
  size_t consumed = 0;
  for (int count = 0; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}